

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O3

void __thiscall
compiler::CompilerAstWalker::onExitAssignStatementAstNode
          (CompilerAstWalker *this,AssignStatementAstNode *node)

{
  bool mustBeTrue;
  ByteCode bc;
  string local_48;
  size_t local_28;
  size_t index;
  
  local_28 = 0;
  mustBeTrue = EmissionContext::GetDeclarationIndex
                         ((this->ec).
                          super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,&((node->identifier).
                                   super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                                  value,&local_28,false);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Could not find local declaration for assign statement","");
  Error::assertWithPanic(mustBeTrue,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  bc.parameter = local_28;
  bc._0_8_ = 0x10;
  EmissionContext::EmitByteCode
            ((this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,bc);
  return;
}

Assistant:

void onExitAssignStatementAstNode(AssignStatementAstNode* node) noexcept override {
    std::size_t index = 0;
    bool find = this->ec->GetDeclarationIndex(node->identifier->value, index, false);
    Error::assertWithPanic(find, "Could not find local declaration for assign statement");
    this->emit(bytecode::ByteCodeInstruction::SetLocal, index);
  }